

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int big2_ignoreSectionTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char **ppcVar1;
  uint local_44;
  size_t n;
  int level;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  n._4_4_ = 0;
  ppcVar1 = (char **)ptr;
  nextTokPtr_local = (char **)end;
  if (((long)end - (long)ptr & 1U) != 0) {
    nextTokPtr_local = (char **)(ptr + ((long)end - (long)ptr & 0xfffffffffffffffe));
    ppcVar1 = (char **)ptr;
  }
  do {
    end_local = (char *)ppcVar1;
    if ((char **)end_local == nextTokPtr_local) {
      return -1;
    }
    if (*end_local == '\0') {
      local_44 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)end_local[1]);
    }
    else {
      local_44 = unicode_byte_type(*end_local,end_local[1]);
    }
    switch(local_44) {
    case 0:
    case 1:
    case 8:
      *nextTokPtr = end_local;
      return 0;
    case 2:
      ppcVar1 = (char **)(end_local + 2);
      if (ppcVar1 == nextTokPtr_local) {
        return -1;
      }
      if ((*(char *)ppcVar1 == '\0') && (end_local[3] == '!')) {
        ppcVar1 = (char **)(end_local + 4);
        if (ppcVar1 == nextTokPtr_local) {
          return -1;
        }
        if ((*(char *)ppcVar1 == '\0') && (end_local[5] == '[')) {
          n._4_4_ = n._4_4_ + 1;
          ppcVar1 = (char **)(end_local + 6);
        }
      }
      break;
    default:
      ppcVar1 = (char **)(end_local + 2);
      break;
    case 4:
      ppcVar1 = (char **)(end_local + 2);
      if (ppcVar1 == nextTokPtr_local) {
        return -1;
      }
      if ((*(char *)ppcVar1 == '\0') && (end_local[3] == ']')) {
        ppcVar1 = (char **)(end_local + 4);
        if (ppcVar1 == nextTokPtr_local) {
          return -1;
        }
        if ((*(char *)ppcVar1 == '\0') && (end_local[5] == '>')) {
          if (n._4_4_ == 0) {
            *nextTokPtr = end_local + 6;
            return 0x2a;
          }
          n._4_4_ = n._4_4_ + -1;
          ppcVar1 = (char **)(end_local + 6);
        }
      }
      break;
    case 5:
      if ((long)nextTokPtr_local - (long)end_local < 2) {
        return -2;
      }
      ppcVar1 = (char **)(end_local + 2);
      break;
    case 6:
      if ((long)nextTokPtr_local - (long)end_local < 3) {
        return -2;
      }
      ppcVar1 = (char **)(end_local + 3);
      break;
    case 7:
      if ((long)nextTokPtr_local - (long)end_local < 4) {
        return -2;
      }
      ppcVar1 = (char **)(end_local + 4);
    }
  } while( true );
}

Assistant:

static
int PREFIX(ignoreSectionTok)(const ENCODING *enc, const char *ptr, const char *end,
                             const char **nextTokPtr)
{
  int level = 0;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      end = ptr + n;
    }
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_LT:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_EXCL)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_LSQB)) {
          ++level;
          ptr += MINBPC(enc);
        }
      }
      break;
    case BT_RSQB:
      if ((ptr += MINBPC(enc)) == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_RSQB)) {
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
          ptr += MINBPC(enc);
          if (level == 0) {
            *nextTokPtr = ptr;
            return XML_TOK_IGNORE_SECT;
          }
          --level;
        }
      }
      break;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}